

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

StringRef __thiscall llbuild::buildsystem::BuildKey::getContentExclusionPatterns(BuildKey *this)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  bool local_41;
  uint32_t dataSize;
  uint32_t nameSize;
  BuildKey *this_local;
  ulong local_28;
  
  bVar2 = isDirectoryTreeSignature(this);
  local_41 = true;
  if (!bVar2) {
    bVar2 = isDirectoryTreeStructureSignature(this);
    local_41 = true;
    if (!bVar2) {
      local_41 = isFilteredDirectoryContents(this);
    }
  }
  if (local_41 == false) {
    __assert_fail("isDirectoryTreeSignature() || isDirectoryTreeStructureSignature() || isFilteredDirectoryContents()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                  ,0x108,
                  "StringRef llbuild::buildsystem::BuildKey::getContentExclusionPatterns() const");
  }
  pcVar3 = core::KeyType::data(&this->key);
  uVar1 = *(uint *)(pcVar3 + 1);
  sVar4 = core::KeyType::size(&this->key);
  pcVar3 = core::KeyType::data(&this->key);
  this_local = (BuildKey *)(pcVar3 + (ulong)uVar1 + 5);
  local_28 = (ulong)(((int)sVar4 - uVar1) - 5);
  return _this_local;
}

Assistant:

StringRef getContentExclusionPatterns() const {
    assert(isDirectoryTreeSignature() || isDirectoryTreeStructureSignature() || isFilteredDirectoryContents());
    uint32_t nameSize;
    memcpy(&nameSize, &key.data()[1], sizeof(uint32_t));
    uint32_t dataSize = key.size() - 1 - sizeof(uint32_t) - nameSize;
    return StringRef(&key.data()[1 + sizeof(uint32_t) + nameSize], dataSize);
  }